

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resp_msg.hxx
# Opt level: O0

void __thiscall
nuraft::resp_msg::resp_msg
          (resp_msg *this,ulong term,msg_type type,int32 src,int32 dst,ulong next_idx,bool accepted)

{
  undefined1 uVar1;
  int in_ECX;
  msg_type in_EDX;
  ulong in_RSI;
  msg_base *in_RDI;
  int in_R8D;
  _func_int **in_R9;
  undefined1 in_stack_00000008;
  undefined7 in_stack_ffffffffffffffd0;
  
  uVar1 = in_stack_00000008 & request_vote_request;
  msg_base::msg_base(in_RDI,in_RSI,in_EDX,in_ECX,in_R8D);
  in_RDI->_vptr_msg_base = (_func_int **)&PTR__resp_msg_006e62d0;
  in_RDI[1]._vptr_msg_base = in_R9;
  in_RDI[1].term_ = 0;
  *(undefined1 *)&in_RDI[1].type_ = uVar1 & request_vote_request;
  std::shared_ptr<nuraft::buffer>::shared_ptr
            ((shared_ptr<nuraft::buffer> *)CONCAT17(uVar1,in_stack_ffffffffffffffd0),in_RDI);
  std::shared_ptr<nuraft::peer>::shared_ptr((shared_ptr<nuraft::peer> *)0x201f40);
  std::function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)>::function
            ((function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffd0),in_RDI);
  std::
  function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
  ::function((function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
              *)CONCAT17(uVar1,in_stack_ffffffffffffffd0),in_RDI);
  in_RDI[4].dst_ = 0;
  return;
}

Assistant:

resp_msg(ulong term,
             msg_type type,
             int32 src,
             int32 dst,
             ulong next_idx = 0L,
             bool accepted = false)
        : msg_base(term, type, src, dst)
        , next_idx_(next_idx)
        , next_batch_size_hint_in_bytes_(0)
        , accepted_(accepted)
        , ctx_(nullptr)
        , cb_func_(nullptr)
        , async_cb_func_(nullptr)
        , result_code_(cmd_result_code::OK)
        {}